

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

result __thiscall
dtc::anon_unknown_1::binary_operator<8,_std::greater<unsigned_long_long>_>::operator()
          (binary_operator<8,_std::greater<unsigned_long_long>_> *this)

{
  int iVar1;
  type peVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte extraout_DL;
  byte extraout_DL_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  result rVar4;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  int local_6c;
  unsigned_long_long local_68;
  unsigned_long_long local_58;
  result r;
  unsigned_long_long local_38;
  result l;
  greater<unsigned_long_long> op;
  binary_operator<8,_std::greater<unsigned_long_long>_> *this_local;
  bool local_10;
  
  peVar2 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&(this->super_binary_operator_base).lhs);
  iVar1 = (**peVar2->_vptr_expression)();
  r._8_8_ = CONCAT44(extraout_var,iVar1);
  local_38 = r._8_8_;
  l.first._0_1_ = extraout_DL;
  peVar2 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&(this->super_binary_operator_base).rhs);
  iVar1 = (**peVar2->_vptr_expression)();
  local_68 = CONCAT44(extraout_var_00,iVar1);
  local_58 = local_68;
  if ((((byte)l.first & 1) == 0) || ((extraout_DL_00 & 1) == 0)) {
    local_6c = 0;
    local_6d = false;
    std::pair<unsigned_long_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long_long,_bool> *)&this_local,&local_6c,&local_6d);
    uVar3 = extraout_RDX;
  }
  else {
    local_6e = std::greater<unsigned_long_long>::operator()
                         ((greater<unsigned_long_long> *)&l.field_0xf,&local_38,&local_58);
    local_6f = true;
    std::pair<unsigned_long_long,_bool>::pair<bool,_bool,_true>
              ((pair<unsigned_long_long,_bool> *)&this_local,&local_6e,&local_6f);
    uVar3 = extraout_RDX_00;
  }
  rVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  rVar4.second = local_10;
  rVar4.first = (unsigned_long_long)this_local;
  return rVar4;
}

Assistant:

result operator()() override
	{
		Op op;
		result l = (*lhs)();
		result r = (*rhs)();
		if (!(l.second && r.second))
		{
			return {0, false};
		}
		return {op(l.first, r.first), true};
	}